

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

shared_ptr<rcg::Interface> __thiscall rcg::Device::getParent(Device *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<rcg::Interface> *in_RSI;
  element_type *in_RDI;
  shared_ptr<rcg::Interface> sVar1;
  
  std::shared_ptr<rcg::Interface>::shared_ptr(in_RSI,(shared_ptr<rcg::Interface> *)in_RDI);
  sVar1.super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<rcg::Interface>)
         sVar1.super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Interface> Device::getParent() const
{
  return parent;
}